

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int *__s;
  ulong uVar1;
  bool bVar2;
  int iVar3;
  uint compressed_length;
  ostream *poVar4;
  void *pvVar5;
  size_type __n;
  long lVar6;
  size_type __rlen;
  char *pcVar7;
  path *this;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> input_wrapped;
  path in_filename;
  path out_filename;
  char *end;
  ofstream out_file;
  string_view arg;
  undefined1 auStack_25d8 [8];
  DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> local_25d0;
  long local_25c8;
  ulong local_25c0;
  char **local_25b8;
  ulong local_25b0;
  ostream *local_25a8;
  ulong local_25a0;
  path local_2598;
  path local_2570;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2548;
  undefined4 auStack_252c [123];
  long local_2340;
  filebuf local_2338 [20];
  undefined4 auStack_2324 [55];
  ios_base local_2248 [264];
  undefined1 local_2140 [8];
  int *local_2138 [2];
  undefined4 auStack_2124 [251];
  uint local_1d38;
  uint local_1cf8;
  uint local_1914;
  uint local_1838;
  uint local_1124;
  uint local_118;
  uint local_38;
  
  std::filesystem::__cxx11::path::path(&local_2598);
  std::filesystem::__cxx11::path::path(&local_2570);
  if (1 < argc) {
    uVar10 = (ulong)(argc - 1);
    local_25a8 = (ostream *)0x1000;
    uVar8 = 0;
    local_25b0 = 0;
    local_25a0 = 0;
    local_25c8 = 0;
    local_25c0 = uVar10;
    local_25b8 = argv;
LAB_00102b2d:
    __s = (int *)argv[uVar8 + 1];
    poVar4 = (ostream *)strlen((char *)__s);
    local_2140 = (undefined1  [8])poVar4;
    local_2138[0] = __s;
    if ((char)*__s == '-') {
      if (poVar4 == (ostream *)0x6) {
        if ((short)__s[1] != 0x706c || *__s != 0x65682d2d) {
          if (*(char *)((long)__s + 1) == 'm') goto LAB_00102bcf;
          goto LAB_00102c6f;
        }
LAB_00102c48:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "Clownacy\'s LZSS compression tool\n\nUsage: clownlzss [options] [in-filename] [out-filename]\nOptions:\n\n Format:\n  -ch    Chameleon\n  -c     Comper\n  -e     Enigma\n  -f     Faxman\n  -g     GBA BIOS\n  -gv    GBA BIOS (VRAM safe)\n  -k     Kosinski\n  -kp    Kosinski+\n  -ra    Rage\n  -r     Rocket\n  -s     Saxman\n  -sn    Saxman (with no header)\n\n Misc:\n  -m[=MODULE_SIZE]  Compresses into modules\n                    MODULE_SIZE controls the module size (defaults to 0x1000)\n  -d     Decompress\n"
                   ,0x1ea);
        lVar6 = local_25c8;
      }
      else {
        if (poVar4 == (ostream *)0x2) {
          if ((short)*__s == 0x682d) goto LAB_00102c48;
          if (*(char *)((long)__s + 1) == 'm') {
LAB_00102bcf:
            pvVar5 = memchr(__s,0x3d,(size_t)poVar4);
            poVar4 = (ostream *)((long)pvVar5 - (long)__s);
            if (poVar4 == (ostream *)0xffffffffffffffff || pvVar5 == (void *)0x0) goto LAB_00102c3f;
            poVar4 = (ostream *)
                     strtoul((char *)((ostream *)((long)__s + (long)poVar4) + 1),
                             (char **)&local_2548,0);
            if (*local_2548.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start != '\0') {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Invalid parameter to -m\n",0x18);
              iVar3 = 1;
              goto LAB_00102e77;
            }
            local_25a8 = poVar4;
            if ((ostream *)0x1000 < poVar4) {
              poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,
                                  "Warning: the moduled format header does not fully support sizes greater than\n 0x1000 - header will likely be invalid!\n"
                                  ,0x76);
            }
LAB_00102c3f:
            local_25a0 = CONCAT71((int7)((ulong)poVar4 >> 8),1);
            lVar6 = local_25c8;
            goto LAB_00102cb3;
          }
        }
        else {
          if (*(char *)((long)__s + 1) == 'm') {
            if (poVar4 != (ostream *)0x0) goto LAB_00102bcf;
            goto LAB_00102c3f;
          }
          if (poVar4 != (ostream *)0x2) goto LAB_00102c6f;
        }
        if ((short)*__s == 0x642d) {
          local_25b0 = CONCAT71((int7)((ulong)poVar4 >> 8),1);
          lVar6 = local_25c8;
        }
        else {
LAB_00102c6f:
          lVar9 = 0;
          do {
            if ((poVar4 == *(ostream **)((long)&modes._M_elems[0].command._M_string_length + lVar9))
               && ((lVar6 = (long)&modes._M_elems[0].command._M_dataplus._M_p + lVar9,
                   argv = local_25b8, uVar10 = local_25c0, poVar4 == (ostream *)0x0 ||
                   (iVar3 = bcmp(__s,*(void **)((long)&modes._M_elems[0].command._M_dataplus._M_p +
                                               lVar9),(size_t)poVar4), argv = local_25b8,
                   uVar10 = local_25c0, iVar3 == 0)))) break;
            lVar9 = lVar9 + 0x68;
            argv = local_25b8;
            uVar10 = local_25c0;
            lVar6 = local_25c8;
          } while (lVar9 != 0x4e0);
        }
      }
    }
    else {
      this = &local_2570;
      if (local_2598._M_pathname._M_string_length == 0) {
        this = &local_2598;
      }
      std::filesystem::__cxx11::path::operator=
                (this,(basic_string_view<char,_std::char_traits<char>_> *)local_2140);
      lVar6 = local_25c8;
    }
LAB_00102cb3:
    local_25c8 = lVar6;
    uVar1 = local_25a0;
    lVar6 = local_25c8;
    uVar8 = uVar8 + 1;
    if (uVar8 == uVar10) goto LAB_00102cdb;
    goto LAB_00102b2d;
  }
  if (local_2598._M_pathname._M_string_length == 0) goto LAB_00102e42;
LAB_00102e34:
  lVar6 = 0x1c;
  pcVar7 = "Error: Format not specified\n";
  goto LAB_00102e4e;
LAB_00102cdb:
  if (local_2598._M_pathname._M_string_length != 0) {
    if (local_25c8 != 0) {
      if (local_2570._M_pathname._M_string_length == 0) {
        std::filesystem::__cxx11::path::operator=
                  (&local_2570,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(((uint)local_25a0 & 1) << 5) + local_25c8 + 0x28));
      }
      std::ofstream::ofstream(&local_2340);
      poVar4 = local_25a8;
      uVar10 = local_25b0;
      lVar9 = *(long *)(local_2340 + -0x18);
      *(undefined4 *)((long)auStack_2324 + lVar9) = 7;
      std::ios::clear((int)auStack_25d8 + (int)lVar9 + 0x298);
      std::ofstream::open((char *)&local_2340,(_Ios_Openmode)local_2570._M_pathname._M_dataplus._M_p
                         );
      if ((uVar10 & 1) == 0) {
        __n = std::filesystem::file_size(&local_2598);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&local_2548,__n,(allocator_type *)local_2140);
        std::ifstream::ifstream(local_2140);
        lVar9 = *(long *)((long)local_2140 + -0x18);
        *(undefined4 *)((long)auStack_2124 + lVar9) = 7;
        std::ios::clear((int)auStack_25d8 + (int)lVar9 + 0x498);
        std::ifstream::open(local_2140,(_Ios_Openmode)local_2598._M_pathname._M_dataplus._M_p);
        std::istream::read(local_2140,
                           (long)local_2548.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
        std::ifstream::~ifstream(local_2140);
        switch(*(undefined4 *)(lVar6 + 0x20)) {
        case 0:
          if ((uVar1 & 1) == 0) {
            local_2140 = (undefined1  [8])&local_2340;
            bVar2 = ClownLZSS::Internal::Chameleon::Compress<std::ofstream>
                              (local_2548.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                               (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                *)local_2140);
          }
          else {
            local_2140 = (undefined1  [8])&local_2340;
            bVar2 = ClownLZSS::Internal::
                    ModuledCompressionWrapper<2u,(ClownLZSS::Internal::Endian)0,std::ofstream>
                              (local_2548.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                               (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                *)local_2140,ClownLZSS::Internal::Chameleon::Compress<std::ofstream>
                               ,(size_t)poVar4,2);
          }
          break;
        case 1:
          if ((uVar1 & 1) == 0) {
            local_2140 = (undefined1  [8])&local_2340;
            bVar2 = ClownLZSS::Internal::Comper::Compress<std::ofstream>
                              (local_2548.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                               (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                *)local_2140);
          }
          else {
            local_2140 = (undefined1  [8])&local_2340;
            bVar2 = ClownLZSS::Internal::
                    ModuledCompressionWrapper<2u,(ClownLZSS::Internal::Endian)0,std::ofstream>
                              (local_2548.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                               (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                *)local_2140,ClownLZSS::Internal::Comper::Compress<std::ofstream>,
                               (size_t)poVar4,2);
          }
          break;
        case 2:
          if ((uVar1 & 1) == 0) {
            bVar2 = ClownLZSS::EnigmaCompress<std::ofstream&>
                              (local_2548.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                               (basic_ofstream<char,_std::char_traits<char>_> *)&local_2340);
          }
          else {
            local_2140 = (undefined1  [8])&local_2340;
            bVar2 = ClownLZSS::Internal::
                    ModuledCompressionWrapper<2u,(ClownLZSS::Internal::Endian)0,std::ofstream>
                              (local_2548.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                               (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                *)local_2140,ClownLZSS::Internal::Enigma::Compress<std::ofstream>,
                               (size_t)poVar4,2);
          }
          break;
        case 3:
          if ((uVar1 & 1) == 0) {
            local_2140 = (undefined1  [8])&local_2340;
            bVar2 = ClownLZSS::Internal::Faxman::Compress<std::ofstream>
                              (local_2548.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                               (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                *)local_2140);
          }
          else {
            local_2140 = (undefined1  [8])&local_2340;
            bVar2 = ClownLZSS::Internal::
                    ModuledCompressionWrapper<2u,(ClownLZSS::Internal::Endian)0,std::ofstream>
                              (local_2548.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                               (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                *)local_2140,ClownLZSS::Internal::Faxman::Compress<std::ofstream>,
                               (size_t)poVar4,2);
          }
          break;
        case 4:
          if ((uVar1 & 1) == 0) {
            local_2140 = (undefined1  [8])&local_2340;
            bVar2 = ClownLZSS::Internal::Gba::
                    Compress<std::ofstream,unsigned_long(*)(unsigned_long,unsigned_long,void*)>
                              (local_2548.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                               ClownLZSS::Internal::Gba::GetMatchCost,
                               (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                *)local_2140);
          }
          else {
            local_2140 = (undefined1  [8])&local_2340;
            bVar2 = ClownLZSS::Internal::
                    ModuledCompressionWrapper<4u,(ClownLZSS::Internal::Endian)1,std::ofstream>
                              (local_2548.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                               (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                *)local_2140,ClownLZSS::Internal::Gba::Compress<std::ofstream>,
                               (size_t)poVar4,4);
          }
          break;
        case 5:
          if ((uVar1 & 1) == 0) {
            local_2140 = (undefined1  [8])&local_2340;
            bVar2 = ClownLZSS::Internal::Gba::
                    Compress<std::ofstream,unsigned_long(*)(unsigned_long,unsigned_long,void*)>
                              (local_2548.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                               ClownLZSS::Internal::Gba::GetMatchCostVramSafe,
                               (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                *)local_2140);
          }
          else {
            local_2140 = (undefined1  [8])&local_2340;
            bVar2 = ClownLZSS::Internal::
                    ModuledCompressionWrapper<4u,(ClownLZSS::Internal::Endian)1,std::ofstream>
                              (local_2548.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                               (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                *)local_2140,
                               ClownLZSS::Internal::Gba::CompressVramSafe<std::ofstream>,
                               (size_t)poVar4,4);
          }
          break;
        case 6:
          if ((uVar1 & 1) == 0) {
            local_2140 = (undefined1  [8])&local_2340;
            bVar2 = ClownLZSS::Internal::Kosinski::Compress<std::ofstream>
                              (local_2548.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                               (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                *)local_2140);
          }
          else {
            local_2140 = (undefined1  [8])&local_2340;
            bVar2 = ClownLZSS::Internal::
                    ModuledCompressionWrapper<2u,(ClownLZSS::Internal::Endian)0,std::ofstream>
                              (local_2548.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                               (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                *)local_2140,ClownLZSS::Internal::Kosinski::Compress<std::ofstream>,
                               (size_t)poVar4,0x10);
          }
          break;
        case 7:
          if ((uVar1 & 1) == 0) {
            local_2140 = (undefined1  [8])&local_2340;
            bVar2 = ClownLZSS::Internal::KosinskiPlus::Compress<std::ofstream>
                              (local_2548.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                               (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                *)local_2140);
          }
          else {
            local_2140 = (undefined1  [8])&local_2340;
            bVar2 = ClownLZSS::Internal::
                    ModuledCompressionWrapper<2u,(ClownLZSS::Internal::Endian)0,std::ofstream>
                              (local_2548.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                               (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                *)local_2140,
                               ClownLZSS::Internal::KosinskiPlus::Compress<std::ofstream>,
                               (size_t)poVar4,1);
          }
          break;
        case 8:
          if ((uVar1 & 1) == 0) {
            local_2140 = (undefined1  [8])&local_2340;
            bVar2 = ClownLZSS::Internal::Rage::Compress<std::ofstream>
                              (local_2548.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                               (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                *)local_2140);
          }
          else {
            local_2140 = (undefined1  [8])&local_2340;
            bVar2 = ClownLZSS::Internal::
                    ModuledCompressionWrapper<2u,(ClownLZSS::Internal::Endian)0,std::ofstream>
                              (local_2548.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                               (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                *)local_2140,ClownLZSS::Internal::Rage::Compress<std::ofstream>,
                               (size_t)poVar4,2);
          }
          break;
        case 9:
          if ((uVar1 & 1) == 0) {
            local_2140 = (undefined1  [8])&local_2340;
            bVar2 = ClownLZSS::Internal::Rocket::Compress<std::ofstream>
                              (local_2548.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                               (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                *)local_2140);
          }
          else {
            local_2140 = (undefined1  [8])&local_2340;
            bVar2 = ClownLZSS::Internal::
                    ModuledCompressionWrapper<2u,(ClownLZSS::Internal::Endian)0,std::ofstream>
                              (local_2548.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                               (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                *)local_2140,ClownLZSS::Internal::Rocket::Compress<std::ofstream>,
                               (size_t)poVar4,2);
          }
          break;
        case 10:
          if ((uVar1 & 1) == 0) {
            local_2140 = (undefined1  [8])&local_2340;
            bVar2 = ClownLZSS::Internal::Saxman::
                    CompressWithHeader<ClownLZSS::CompressorOutput<std::ofstream>&>
                              (local_2548.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                               (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                *)local_2140);
          }
          else {
            local_2140 = (undefined1  [8])&local_2340;
            bVar2 = ClownLZSS::Internal::
                    ModuledCompressionWrapper<2u,(ClownLZSS::Internal::Endian)0,std::ofstream>
                              (local_2548.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                               (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                *)local_2140,
                               ClownLZSS::Internal::Saxman::
                               CompressWithHeader<ClownLZSS::CompressorOutput<std::ofstream>&>,
                               (size_t)poVar4,2);
          }
          break;
        case 0xb:
          if ((uVar1 & 1) == 0) {
            local_2140 = (undefined1  [8])&local_2340;
            bVar2 = ClownLZSS::Internal::Saxman::Compress<std::ofstream>
                              (local_2548.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                               (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                *)local_2140);
          }
          else {
            local_2140 = (undefined1  [8])&local_2340;
            bVar2 = ClownLZSS::Internal::
                    ModuledCompressionWrapper<2u,(ClownLZSS::Internal::Endian)0,std::ofstream>
                              (local_2548.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_2548.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                               (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                *)local_2140,
                               ClownLZSS::Internal::Saxman::
                               CompressWithHeader<ClownLZSS::CompressorOutput<std::ofstream>&>,
                               (size_t)poVar4,2);
          }
          break;
        default:
          bVar2 = false;
        }
        if (local_2548.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (uchar *)0x0) {
          operator_delete(local_2548.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_2548.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_2548.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        iVar3 = 0;
        if (bVar2 == false) {
          iVar3 = 1;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error: File could not be compressed\n",0x24);
        }
      }
      else {
        std::ifstream::ifstream(&local_2548);
        lVar9 = *(long *)(local_2548.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start + -0x18);
        *(undefined4 *)((long)auStack_252c + lVar9) = 7;
        std::ios::clear((int)auStack_25d8 + (int)lVar9 + 0x90);
        std::ifstream::open((char *)&local_2548,
                            (_Ios_Openmode)local_2598._M_pathname._M_dataplus._M_p);
        switch(*(undefined4 *)(lVar6 + 0x20)) {
        case 0:
          if ((uVar1 & 1) == 0) {
            local_1838 = 0;
            local_25d0.
            super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
            .input = (DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      )(DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        )&local_2548;
            local_2140 = (undefined1  [8])&local_2340;
            ClownLZSS::Internal::Chameleon::Decompress<std::ifstream,std::ofstream&>
                      (&local_25d0,(DecompressorOutput<std::basic_ofstream<char>_&> *)local_2140);
          }
          else {
            local_1838 = 0;
            local_25d0.
            super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
            .input = (DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      )(istream *)&local_2548;
            local_2140 = (undefined1  [8])&local_2340;
            ClownLZSS::Internal::
            ModuledDecompressionWrapper<2u,(ClownLZSS::Internal::Endian)0,std::ifstream,ClownLZSS::DecompressorOutput<std::ofstream&,2047u,255u,_1>>
                      (&local_25d0,
                       (DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_2047U,_255U,__1>
                        *)local_2140,
                       ClownLZSS::Internal::Chameleon::Decompress<std::ifstream,std::ofstream&>,2);
          }
          break;
        case 1:
          if ((uVar1 & 1) == 0) {
            local_1d38 = 0;
            local_25d0.
            super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
            .input = (DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      )(DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        )&local_2548;
            local_2140 = (undefined1  [8])&local_2340;
            ClownLZSS::Internal::Comper::Decompress<std::ifstream,std::ofstream&>
                      (&local_25d0,(DecompressorOutput<std::basic_ofstream<char>_&> *)local_2140);
          }
          else {
            local_1d38 = 0;
            local_25d0.
            super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
            .input = (DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      )(DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        )&local_2548;
            local_2140 = (undefined1  [8])&local_2340;
            ClownLZSS::Internal::
            ModuledDecompressionWrapper<2u,(ClownLZSS::Internal::Endian)0,std::ifstream,ClownLZSS::DecompressorOutput<std::ofstream&,512u,512u,_1>>
                      (&local_25d0,
                       (DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_512U,_512U,__1>
                        *)local_2140,
                       ClownLZSS::Internal::Comper::Decompress<std::ifstream,std::ofstream&>,2);
          }
          break;
        case 2:
          local_25d0.
          super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
          .input = (DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                    )(DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      )&local_2340;
          local_2140 = (undefined1  [8])&local_2548;
          if ((uVar1 & 1) == 0) {
            ClownLZSS::Internal::Enigma::Decompress<std::ifstream,std::ofstream&>
                      ((DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                       local_2140,(DecompressorOutput<std::basic_ofstream<char>_&> *)&local_25d0);
          }
          else {
            ClownLZSS::Internal::
            ModuledDecompressionWrapper<2u,(ClownLZSS::Internal::Endian)0,std::ifstream,ClownLZSS::DecompressorOuputBasic<std::ofstream&>>
                      ((DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                       local_2140,
                       (DecompressorOuputBasic<std::basic_ofstream<char,_std::char_traits<char>_>_&>
                        *)&local_25d0,
                       ClownLZSS::Internal::Enigma::Decompress<std::ifstream,std::ofstream&>,2);
          }
          break;
        case 3:
          if ((uVar1 & 1) == 0) {
            local_1914 = 0;
            local_25d0.
            super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
            .input = (DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      )(DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        )&local_2548;
            local_2140 = (undefined1  [8])&local_2340;
            ClownLZSS::Internal::Faxman::Decompress<std::ifstream,std::ofstream&>
                      (&local_25d0,(DecompressorOutput<std::basic_ofstream<char>_&> *)local_2140);
          }
          else {
            local_1914 = 0;
            local_25d0.
            super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
            .input = (DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      )(DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        )&local_2548;
            local_2140 = (undefined1  [8])&local_2340;
            ClownLZSS::Internal::
            ModuledDecompressionWrapper<2u,(ClownLZSS::Internal::Endian)0,std::ifstream,ClownLZSS::DecompressorOutput<std::ofstream&,2048u,34u,_1>>
                      (&local_25d0,
                       (DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_2048U,_34U,__1>
                        *)local_2140,
                       ClownLZSS::Internal::Faxman::Decompress<std::ifstream,std::ofstream&>,2);
          }
          break;
        case 4:
        case 5:
          if ((uVar1 & 1) == 0) {
            ClownLZSS::GbaDecompress<std::ifstream&,std::ofstream&>
                      ((basic_ifstream<char,_std::char_traits<char>_> *)&local_2548,
                       (basic_ofstream<char,_std::char_traits<char>_> *)&local_2340);
          }
          else {
            local_1124 = 0;
            local_25d0.
            super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
            .input = (DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      )(DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        )&local_2548;
            local_2140 = (undefined1  [8])&local_2340;
            ClownLZSS::Internal::
            ModuledDecompressionWrapper<4u,(ClownLZSS::Internal::Endian)1,std::ifstream,ClownLZSS::DecompressorOutput<std::ofstream&,4096u,18u,_1>>
                      (&local_25d0,
                       (DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_4096U,_18U,__1>
                        *)local_2140,
                       ClownLZSS::Internal::Gba::Decompress<std::ifstream,std::ofstream&>,4);
          }
          break;
        case 6:
          if ((uVar1 & 1) == 0) {
            local_38 = 0;
            local_25d0.
            super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
            .input = (DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      )(DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        )&local_2548;
            local_2140 = (undefined1  [8])&local_2340;
            ClownLZSS::Internal::Kosinski::Decompress<std::ifstream,std::ofstream&>
                      (&local_25d0,(DecompressorOutput<std::basic_ofstream<char>_&> *)local_2140);
          }
          else {
            local_38 = 0;
            local_25d0.
            super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
            .input = (DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      )(DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        )&local_2548;
            local_2140 = (undefined1  [8])&local_2340;
            ClownLZSS::Internal::
            ModuledDecompressionWrapper<2u,(ClownLZSS::Internal::Endian)0,std::ifstream,ClownLZSS::DecompressorOutput<std::ofstream&,8192u,256u,_1>>
                      (&local_25d0,
                       (DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_8192U,_256U,__1>
                        *)local_2140,
                       ClownLZSS::Internal::Kosinski::Decompress<std::ifstream,std::ofstream&>,0x10)
            ;
          }
          break;
        case 7:
          if ((uVar1 & 1) == 0) {
            local_38 = 0;
            local_25d0.
            super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
            .input = (DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      )(DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        )&local_2548;
            local_2140 = (undefined1  [8])&local_2340;
            ClownLZSS::Internal::KosinskiPlus::Decompress<std::ifstream,std::ofstream&>
                      (&local_25d0,(DecompressorOutput<std::basic_ofstream<char>_&> *)local_2140);
          }
          else {
            local_38 = 0;
            local_25d0.
            super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
            .input = (DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      )(DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        )&local_2548;
            local_2140 = (undefined1  [8])&local_2340;
            ClownLZSS::Internal::
            ModuledDecompressionWrapper<2u,(ClownLZSS::Internal::Endian)0,std::ifstream,ClownLZSS::DecompressorOutput<std::ofstream&,8192u,256u,_1>>
                      (&local_25d0,
                       (DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_8192U,_256U,__1>
                        *)local_2140,
                       ClownLZSS::Internal::KosinskiPlus::Decompress<std::ifstream,std::ofstream&>,1
                      );
          }
          break;
        case 8:
          if ((uVar1 & 1) == 0) {
            local_118 = 0;
            local_25d0.
            super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
            .input = (DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      )(DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        )&local_2548;
            local_2140 = (undefined1  [8])&local_2340;
            ClownLZSS::Internal::Rage::Decompress<std::ifstream,std::ofstream&>
                      (&local_25d0,(DecompressorOutput<std::basic_ofstream<char>_&> *)local_2140);
          }
          else {
            local_118 = 0;
            local_25d0.
            super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
            .input = (DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      )(DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        )&local_2548;
            local_2140 = (undefined1  [8])&local_2340;
            ClownLZSS::Internal::
            ModuledDecompressionWrapper<2u,(ClownLZSS::Internal::Endian)0,std::ifstream,ClownLZSS::DecompressorOutput<std::ofstream&,8191u,31u,_1>>
                      (&local_25d0,
                       (DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_8191U,_31U,__1>
                        *)local_2140,
                       ClownLZSS::Internal::Rage::Decompress<std::ifstream,std::ofstream&>,2);
          }
          break;
        case 9:
          if ((uVar1 & 1) == 0) {
            local_25d0.
            super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
            .input = (DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      )(DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        )&local_2548;
            memset(local_2138,0x20,0x43f);
            local_1cf8 = 0;
            local_2140 = (undefined1  [8])&local_2340;
            ClownLZSS::Internal::Rocket::Decompress<std::ifstream,std::ofstream&>
                      (&local_25d0,(DecompressorOutput<std::basic_ofstream<char>_&> *)local_2140);
          }
          else {
            local_25d0.
            super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
            .input = (DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      )(DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        )&local_2548;
            memset(local_2138,0x20,0x43f);
            local_1cf8 = 0;
            local_2140 = (undefined1  [8])&local_2340;
            ClownLZSS::Internal::
            ModuledDecompressionWrapper<2u,(ClownLZSS::Internal::Endian)0,std::ifstream,ClownLZSS::DecompressorOutput<std::ofstream&,1024u,64u,32>>
                      (&local_25d0,
                       (DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_1024U,_64U,_32>
                        *)local_2140,
                       ClownLZSS::Internal::Rocket::Decompress<std::ifstream,std::ofstream&>,2);
          }
          break;
        case 10:
          if ((uVar1 & 1) == 0) {
            local_1124 = 0;
            local_25d0.
            super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
            .input = (DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      )(DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        )&local_2548;
            local_2140 = (undefined1  [8])&local_2340;
            ClownLZSS::Internal::Saxman::Decompress<std::ifstream,std::ofstream&>
                      (&local_25d0,(DecompressorOutput<std::basic_ofstream<char>_&> *)local_2140);
          }
          else {
            local_1124 = 0;
            local_25d0.
            super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
            .input = (DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      )(DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        )&local_2548;
            local_2140 = (undefined1  [8])&local_2340;
            ClownLZSS::Internal::
            ModuledDecompressionWrapper<2u,(ClownLZSS::Internal::Endian)0,std::ifstream,ClownLZSS::DecompressorOutput<std::ofstream&,4096u,18u,_1>>
                      (&local_25d0,
                       (DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_4096U,_18U,__1>
                        *)local_2140,
                       ClownLZSS::Internal::Saxman::Decompress<std::ifstream,std::ofstream&>,2);
          }
          break;
        case 0xb:
          if ((uVar1 & 1) == 0) {
            compressed_length = std::filesystem::file_size(&local_2598);
            local_1124 = 0;
            local_25d0.
            super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
            .input = (DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      )(DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        )&local_2548;
            local_2140 = (undefined1  [8])&local_2340;
            ClownLZSS::Internal::Saxman::Decompress<std::ifstream,std::ofstream&>
                      (&local_25d0,(DecompressorOutput<std::basic_ofstream<char>_&> *)local_2140,
                       compressed_length);
          }
          else {
            local_1124 = 0;
            local_25d0.
            super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
            .input = (DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      )(DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        )&local_2548;
            local_2140 = (undefined1  [8])&local_2340;
            ClownLZSS::Internal::
            ModuledDecompressionWrapper<2u,(ClownLZSS::Internal::Endian)0,std::ifstream,ClownLZSS::DecompressorOutput<std::ofstream&,4096u,18u,_1>>
                      (&local_25d0,
                       (DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_4096U,_18U,__1>
                        *)local_2140,
                       ClownLZSS::Internal::Saxman::Decompress<std::ifstream,std::ofstream&>,2);
          }
        }
        std::ifstream::~ifstream(&local_2548);
        iVar3 = 0;
      }
      local_2340 = _VTT;
      *(undefined8 *)(local_2338 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
      std::filebuf::~filebuf(local_2338);
      std::ios_base::~ios_base(local_2248);
      goto LAB_00102e77;
    }
    goto LAB_00102e34;
  }
LAB_00102e42:
  lVar6 = 0x20;
  pcVar7 = "Error: Input file not specified\n";
LAB_00102e4e:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar7,lVar6);
  iVar3 = 1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Clownacy\'s LZSS compression tool\n\nUsage: clownlzss [options] [in-filename] [out-filename]\nOptions:\n\n Format:\n  -ch    Chameleon\n  -c     Comper\n  -e     Enigma\n  -f     Faxman\n  -g     GBA BIOS\n  -gv    GBA BIOS (VRAM safe)\n  -k     Kosinski\n  -kp    Kosinski+\n  -ra    Rage\n  -r     Rocket\n  -s     Saxman\n  -sn    Saxman (with no header)\n\n Misc:\n  -m[=MODULE_SIZE]  Compresses into modules\n                    MODULE_SIZE controls the module size (defaults to 0x1000)\n  -d     Decompress\n"
             ,0x1ea);
LAB_00102e77:
  std::filesystem::__cxx11::path::~path(&local_2570);
  std::filesystem::__cxx11::path::~path(&local_2598);
  return iVar3;
}

Assistant:

int main(int argc, char **argv)
{
	int exit_code = EXIT_SUCCESS;

	const Mode *mode = NULL;
	std::filesystem::path in_filename;
	std::filesystem::path out_filename;
	bool moduled = false, decompress = false;
	std::size_t module_size = 0x1000;

	/* Skip past the executable name */
	--argc;
	++argv;

	/* Parse arguments */
	for (int i = 0; i < argc; ++i)
	{
		const std::string_view arg(argv[i]);

		if (arg[0] == '-')
		{
			if (arg == "-h" || arg == "--help")
			{
				PrintUsage();
			}
			else if (arg[1] == 'm')
			{
				moduled = true;

				const auto argument_position = arg.find_first_of('=');

				if (argument_position != arg.npos)
				{
					char *end;
					unsigned long result = std::strtoul(&argv[i][argument_position + 1], &end, 0);

					if (*end != '\0')
					{
						std::cerr << "Invalid parameter to -m\n";
						exit_code = EXIT_FAILURE;
						break;
					}
					else
					{
						module_size = result;

						if (module_size > 0x1000)
							std::cerr << "Warning: the moduled format header does not fully support sizes greater than\n 0x1000 - header will likely be invalid!\n";
					}
				}
			}
			else if (arg == "-d")
			{
				decompress = true;
			}
			else
			{
				for (const auto &current_mode : modes)
				{
					if (arg == current_mode.command)
					{
						mode = &current_mode;
						break;
					}
				}
			}
		}
		else
		{
			if (in_filename.empty())
				in_filename = arg;
			else
				out_filename = arg;
		}
	}

	if (exit_code != EXIT_FAILURE)
	{
		if (in_filename.empty())
		{
			exit_code = EXIT_FAILURE;
			std::cerr << "Error: Input file not specified\n";
			PrintUsage();
		}
		else if (mode == NULL)
		{
			exit_code = EXIT_FAILURE;
			std::cerr << "Error: Format not specified\n";
			PrintUsage();
		}
		else
		{
			if (out_filename.empty())
				out_filename = moduled ? mode->moduled_default_filename : mode->normal_default_filename;

			try
			{
				std::ofstream out_file;
				out_file.exceptions(out_file.badbit | out_file.eofbit | out_file.failbit);
				out_file.open(out_filename, decompress ? out_file.trunc | out_file.in | out_file.out | out_file.binary : out_file.out | out_file.binary);

				if (decompress)
				{
					std::ifstream in_file;
					in_file.exceptions(in_file.badbit | in_file.eofbit | in_file.failbit);
					in_file.open(in_filename, in_file.in | in_file.binary);

					switch (mode->format)
					{
						case Format::CHAMELEON:
							if (moduled)
								ClownLZSS::ModuledChameleonDecompress(in_file, out_file);
							else
								ClownLZSS::ChameleonDecompress(in_file, out_file);
							break;

						case Format::COMPER:
							if (moduled)
								ClownLZSS::ModuledComperDecompress(in_file, out_file);
							else
								ClownLZSS::ComperDecompress(in_file, out_file);
							break;

						case Format::ENIGMA:
							if (moduled)
								ClownLZSS::ModuledEnigmaDecompress(in_file, out_file);
							else
								ClownLZSS::EnigmaDecompress(in_file, out_file);
							break;

						case Format::FAXMAN:
							if (moduled)
								ClownLZSS::ModuledFaxmanDecompress(in_file, out_file);
							else
								ClownLZSS::FaxmanDecompress(in_file, out_file);
							break;

						case Format::GBA:
						case Format::GBA_VRAM_SAFE:
							if (moduled)
								ClownLZSS::ModuledGbaDecompress(in_file, out_file);
							else
								ClownLZSS::GbaDecompress(in_file, out_file);
							break;

						case Format::KOSINSKI:
							if (moduled)
								ClownLZSS::ModuledKosinskiDecompress(in_file, out_file);
							else
								ClownLZSS::KosinskiDecompress(in_file, out_file);
							break;

						case Format::KOSINSKIPLUS:
							if (moduled)
								ClownLZSS::ModuledKosinskiPlusDecompress(in_file, out_file);
							else
								ClownLZSS::KosinskiPlusDecompress(in_file, out_file);
							break;

						case Format::RAGE:
							if (moduled)
								ClownLZSS::ModuledRageDecompress(in_file, out_file);
							else
								ClownLZSS::RageDecompress(in_file, out_file);
							break;

						case Format::ROCKET:
							if (moduled)
								ClownLZSS::ModuledRocketDecompress(in_file, out_file);
							else
								ClownLZSS::RocketDecompress(in_file, out_file);
							break;

						case Format::SAXMAN:
							if (moduled)
								ClownLZSS::ModuledSaxmanDecompress(in_file, out_file);
							else
								ClownLZSS::SaxmanDecompress(in_file, out_file);
							break;

						case Format::SAXMAN_NO_HEADER:
							if (moduled)
								ClownLZSS::ModuledSaxmanDecompress(in_file, out_file);
							else
								ClownLZSS::SaxmanDecompress(in_file, out_file, std::filesystem::file_size(in_filename));
							break;
					}
				}
				else
				{
					const bool success = [&]() -> bool
					{
						const auto file_buffer = FileToBuffer(in_filename);

						switch (mode->format)
						{
							case Format::CHAMELEON:
								if (moduled)
									return ClownLZSS::ModuledChameleonCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::ChameleonCompress(file_buffer.data(), file_buffer.size(), out_file);

							case Format::COMPER:
								if (moduled)
									return ClownLZSS::ModuledComperCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::ComperCompress(file_buffer.data(), file_buffer.size(), out_file);

							case Format::ENIGMA:
								if (moduled)
									return ClownLZSS::ModuledEnigmaCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::EnigmaCompress(file_buffer.data(), file_buffer.size(), out_file);

							case Format::FAXMAN:
								if (moduled)
									return ClownLZSS::ModuledFaxmanCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::FaxmanCompress(file_buffer.data(), file_buffer.size(), out_file);

							case Format::GBA:
								if (moduled)
									return ClownLZSS::ModuledGbaCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::GbaCompress(file_buffer.data(), file_buffer.size(), out_file);

							case Format::GBA_VRAM_SAFE:
								if (moduled)
									return ClownLZSS::ModuledGbaVramSafeCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::GbaVramSafeCompress(file_buffer.data(), file_buffer.size(), out_file);

							case Format::KOSINSKI:
								if (moduled)
									return ClownLZSS::ModuledKosinskiCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::KosinskiCompress(file_buffer.data(), file_buffer.size(), out_file);

							case Format::KOSINSKIPLUS:
								if (moduled)
									return ClownLZSS::ModuledKosinskiPlusCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::KosinskiPlusCompress(file_buffer.data(), file_buffer.size(), out_file);

							case Format::RAGE:
								if (moduled)
									return ClownLZSS::ModuledRageCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::RageCompress(file_buffer.data(), file_buffer.size(), out_file);

							case Format::ROCKET:
								if (moduled)
									return ClownLZSS::ModuledRocketCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::RocketCompress(file_buffer.data(), file_buffer.size(), out_file);

							case Format::SAXMAN:
								if (moduled)
									return ClownLZSS::ModuledSaxmanCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::SaxmanCompressWithHeader(file_buffer.data(), file_buffer.size(), out_file);

							case Format::SAXMAN_NO_HEADER:
								if (moduled)
									return ClownLZSS::ModuledSaxmanCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::SaxmanCompressWithoutHeader(file_buffer.data(), file_buffer.size(), out_file);
						}

						return false;
					}();

					if (!success)
					{
						exit_code = EXIT_FAILURE;
						std::cerr << "Error: File could not be compressed\n";
					}
				}
			}
			catch (const std::ios_base::failure& fail)
			{
				exit_code = EXIT_FAILURE;
				std::cerr << "Error: File IO failure with description '" << fail.what() << "'\n";
			}
		}
	}

	return exit_code;
}